

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

void __thiscall sf::String::String(String *this,char ansiChar,locale *locale)

{
  uint __c;
  ctype *pcVar1;
  
  (this->m_string)._M_dataplus._M_p = (pointer)&(this->m_string).field_2;
  (this->m_string)._M_string_length = 0;
  (this->m_string).field_2._M_local_buf[0] = 0;
  pcVar1 = std::use_facet<std::ctype<wchar_t>>(locale);
  __c = (**(code **)(*(long *)pcVar1 + 0x50))(pcVar1,(int)ansiChar);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  push_back(&this->m_string,__c);
  return;
}

Assistant:

String::String(char ansiChar, const std::locale& locale)
{
    m_string += Utf32::decodeAnsi(ansiChar, locale);
}